

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void malloc_conf_error(char *msg,char *k,size_t klen,char *v,size_t vlen)

{
  int iVar1;
  
  malloc_printf("<jemalloc>: %s: %.*s:%.*s\n",msg,klen,k,vlen,v);
  iVar1 = strncmp(k,"experimental_",0xd);
  if (iVar1 != 0) {
    had_conf_error = 1;
  }
  return;
}

Assistant:

static void
malloc_conf_error(const char *msg, const char *k, size_t klen, const char *v,
    size_t vlen) {
	malloc_printf("<jemalloc>: %s: %.*s:%.*s\n", msg, (int)klen, k,
	    (int)vlen, v);
	/* If abort_conf is set, error out after processing all options. */
	const char *experimental = "experimental_";
	if (strncmp(k, experimental, strlen(experimental)) == 0) {
		/* However, tolerate experimental features. */
		return;
	}
	had_conf_error = true;
}